

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::XMLLoader::loadMaterial(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  MaterialNode *pMVar2;
  bool bVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  MatteMaterial *this_00;
  undefined8 *in_RDX;
  XMLLoader *this_01;
  string *psVar9;
  Ref<embree::XML> parameters;
  Parms parms;
  string id;
  Ref<embree::SceneGraph::MaterialNode> material;
  string type;
  allocator local_ca;
  allocator local_c9;
  key_type local_c8;
  __atomic_base<unsigned_long> local_c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8 [3];
  string local_88;
  undefined1 local_68 [64];
  
  pXVar1 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&local_b8[0].field_1,"id",(allocator *)(local_68 + 0x20));
  XML::parm(&local_88,pXVar1,(string *)&local_b8[0].field_1);
  std::__cxx11::string::~string((string *)&local_b8[0].field_1);
  bVar3 = std::operator!=(&local_88,"");
  if (bVar3) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                    *)xml[10].ptr,&local_88);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(((_Rep_type *)&(xml[10].ptr)->super_RefCount)->_M_impl).super__Rb_tree_header) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)xml[10].ptr,&local_88);
      pMVar2 = pmVar5->ptr;
      (this->path).filename._M_dataplus._M_p = (pointer)pMVar2;
      if (pMVar2 != (MaterialNode *)0x0) {
        (**(code **)((long)(pMVar2->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
      goto LAB_00175735;
    }
  }
  pXVar1 = (XML *)*in_RDX;
  std::__cxx11::string::string
            ((string *)&local_b8[0].field_1,"parameters",(allocator *)(local_68 + 0x20));
  bVar3 = XML::hasChild(pXVar1,(string *)&local_b8[0].field_1);
  std::__cxx11::string::~string((string *)&local_b8[0].field_1);
  if (bVar3) {
    psVar9 = (string *)*in_RDX;
    std::__cxx11::string::string
              ((string *)&local_b8[0].field_1,"parameters",(allocator *)(local_68 + 0x20));
    XML::child((XML *)&local_c8,psVar9);
    std::__cxx11::string::~string((string *)&local_b8[0].field_1);
    iVar6 = std::
            _Rb_tree<embree::Ref<embree::XML>,_std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
            ::find((_Rb_tree<embree::Ref<embree::XML>,_std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                    *)&(xml[10].ptr)->name,&local_c8);
    if (iVar6._M_node == (_Base_ptr)&((xml[10].ptr)->name)._M_string_length) {
      this_01 = (XMLLoader *)*in_RDX;
      std::__cxx11::string::string((string *)local_68,"code",&local_c9);
      XML::child((XML *)&local_c0,(string *)this_01);
      load<std::__cxx11::string>
                ((string *)&local_b8[0].field_1,this_01,(Ref<embree::XML> *)&local_c0);
      std::__cxx11::string::string((string *)(local_68 + 0x20),(char *)local_b8[0]._0_8_,&local_ca);
      std::__cxx11::string::~string((string *)&local_b8[0].field_1);
      if ((long *)local_c0._M_i != (long *)0x0) {
        (**(code **)(*(long *)local_c0._M_i + 0x18))();
      }
      std::__cxx11::string::~string((string *)local_68);
      psVar9 = (string *)xml;
      loadMaterialParms((Parms *)&local_b8[0].field_1,(XMLLoader *)xml,&local_c8);
      addMaterial((XMLLoader *)local_68,psVar9,(Parms *)(local_68 + 0x20));
      pmVar7 = std::
               map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)&(xml[10].ptr)->name,&local_c8);
      if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_68._0_8_ + 0x10))(local_68._0_8_);
      }
      if (pmVar7->ptr != (MaterialNode *)0x0) {
        (*(pmVar7->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar7->ptr = (MaterialNode *)local_68._0_8_;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)xml[10].ptr,&local_88);
      if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_68._0_8_ + 0x10))(local_68._0_8_);
      }
      if (pmVar5->ptr != (MaterialNode *)0x0) {
        (*(pmVar5->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar5->ptr = (MaterialNode *)local_68._0_8_;
      (this->path).filename._M_dataplus._M_p = (pointer)local_68._0_8_;
      if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_68._0_8_ + 0x10))(local_68._0_8_);
        (**(code **)(*(long *)local_68._0_8_ + 0x18))(local_68._0_8_);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
                   *)&local_b8[0].field_1);
      std::__cxx11::string::~string((string *)(local_68 + 0x20));
    }
    else {
      pmVar7 = std::
               map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)&(xml[10].ptr)->name,&local_c8);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)xml[10].ptr,&local_88);
      if (pmVar7->ptr != (MaterialNode *)0x0) {
        (*(pmVar7->ptr->super_Node).super_RefCount._vptr_RefCount[2])();
      }
      if (pmVar5->ptr != (MaterialNode *)0x0) {
        (*(pmVar5->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pMVar2 = pmVar7->ptr;
      pmVar5->ptr = pMVar2;
      (this->path).filename._M_dataplus._M_p = (pointer)pMVar2;
      if (pMVar2 != (MaterialNode *)0x0) {
        (**(code **)((long)(pMVar2->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
    }
    if (local_c8.ptr != (XML *)0x0) {
      (*((local_c8.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"Warning: material ");
    poVar8 = std::operator<<(poVar8,(string *)&local_88);
    poVar8 = std::operator<<(poVar8," is not defined");
    std::endl<char,std::char_traits<char>>(poVar8);
    this_00 = (MatteMaterial *)SceneGraph::MaterialNode::operator_new(0x90);
    local_b8[0]._0_8_ = (char *)0x3f000000;
    local_b8[0]._8_8_ = 0;
    MatteMaterial::MatteMaterial(this_00,(Vec3fa *)&local_b8[0].field_1);
    (this->path).filename._M_dataplus._M_p = (pointer)this_00;
    (**(code **)(*(long *)&(this_00->super_MaterialNode).super_Node.super_RefCount + 0x10))(this_00)
    ;
  }
LAB_00175735:
  std::__cxx11::string::~string((string *)&local_88);
  return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> XMLLoader::loadMaterial(const Ref<XML>& xml) 
  {
    const std::string id = xml->parm("id");
    if (id != "" && state.materialMap.find(id) != state.materialMap.end())
      return state.materialMap[id];

    if (!xml->hasChild("parameters")) {
      std::cout << "Warning: material " << id << " is not defined" << std::endl;
      return new MatteMaterial(Vec3fa(0.5f,0.0f,0.0f));
    }
    Ref<XML> parameters = xml->child("parameters");
    if (state.materialCache.find(parameters) != state.materialCache.end()) {
      return state.materialMap[id] = state.materialCache[parameters];
    }

    std::string type = load<std::string>(xml->child("code")).c_str();
    Parms parms = loadMaterialParms(parameters);
    Ref<SceneGraph::MaterialNode> material = addMaterial(type,parms);
    state.materialCache[parameters] = material;
    return state.materialMap[id] = material;
  }